

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_convolver_test_utils.cpp
# Opt level: O3

void write_array(string *base,string *name,size_t n,float *x)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  size_t sVar4;
  ofstream out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  long local_228;
  filebuf local_220 [240];
  ios_base local_130 [264];
  
  iVar2 = std::__cxx11::string::compare((char *)base);
  if (iVar2 != 0) {
    std::operator+(&local_248,base,name);
    std::ofstream::ofstream(&local_228,(string *)&local_248,_S_out);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      __assert_fail("out.is_open()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/tests/block_convolver_test_utils.cpp"
                    ,0x43,
                    "void write_array(const std::string &, const std::string &, size_t, float *)");
    }
    if (n != 0) {
      sVar4 = 0;
      do {
        poVar3 = std::ostream::_M_insert<double>((double)x[sVar4]);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        sVar4 = sVar4 + 1;
      } while (n != sVar4);
    }
    local_228 = _VTT;
    *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = _log;
    std::filebuf::~filebuf(local_220);
    std::ios_base::~ios_base(local_130);
  }
  return;
}

Assistant:

void write_array(const std::string &base, const std::string &name, size_t n,
                 float *x) {
  if (base != "") {
    std::ofstream out(base + name);
    assert(out.is_open());
    for (size_t i = 0; i < n; i++) out << x[i] << std::endl;
  }
}